

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

float tcu::computeBilinearSearchStepFromFloatLine(LookupPrecision *prec,ColorLine *line)

{
  float fVar1;
  Vec4 stepCount;
  Vec4 minStep;
  Vec4 d;
  Vector<float,_4> VStack_58;
  tcu local_48 [16];
  tcu local_38 [16];
  tcu local_28 [16];
  
  operator-((tcu *)&VStack_58,&line->p1,&line->p0);
  abs<float,4>(local_28,&VStack_58);
  operator/((tcu *)&VStack_58,(Vector<float,_4> *)local_28,&prec->colorThreshold);
  operator+(local_48,1.0,&VStack_58);
  operator/(local_38,1.0,(Vector<float,_4> *)local_48);
  fVar1 = minComp<float,4>((Vector<float,_4> *)local_38);
  if (fVar1 <= 1.5258789e-05) {
    fVar1 = 1.5258789e-05;
  }
  return fVar1;
}

Assistant:

static float computeBilinearSearchStepFromFloatLine (const LookupPrecision&	prec,
													 const ColorLine&		line)
{
	DE_ASSERT(boolAll(greaterThan(prec.colorThreshold, Vec4(0.0f))));

	const int		maxSteps	= 1<<16;
	const Vec4		d			= abs(line.p1 - line.p0);
	const Vec4		stepCount	= d / prec.colorThreshold;
	const Vec4		minStep		= 1.0f / (stepCount + 1.0f);
	const float		step		= de::max(minComp(minStep), 1.0f / float(maxSteps));

	return step;
}